

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O2

void blend_a64_mask_bn_sx_sy_w8n_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h,
               blend_unit_fn blend)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  long lVar3;
  uint16_t *puVar5;
  uint16_t *puVar6;
  uint16_t *puVar7;
  uint16_t *puVar8;
  long lVar9;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar10 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  __m128i alVar15;
  __m128i alVar16;
  long lVar4;
  
  lVar4 = (ulong)src1_stride * 2;
  lVar3 = (ulong)src0_stride * 2;
  puVar5 = src0;
  puVar7 = src1;
  do {
    puVar6 = puVar5;
    puVar8 = puVar7;
    for (lVar9 = 0; lVar9 < w; lVar9 = lVar9 + 8) {
      puVar1 = mask + lVar9 * 2;
      puVar2 = mask + lVar9 * 2 + (ulong)mask_stride;
      auVar11[0] = *puVar2 + *puVar1;
      auVar11[1] = puVar2[1] + puVar1[1];
      auVar11[2] = puVar2[2] + puVar1[2];
      auVar11[3] = puVar2[3] + puVar1[3];
      auVar11[4] = puVar2[4] + puVar1[4];
      auVar11[5] = puVar2[5] + puVar1[5];
      auVar11[6] = puVar2[6] + puVar1[6];
      auVar11[7] = puVar2[7] + puVar1[7];
      auVar11[8] = puVar2[8] + puVar1[8];
      auVar11[9] = puVar2[9] + puVar1[9];
      auVar11[10] = puVar2[10] + puVar1[10];
      auVar11[0xb] = puVar2[0xb] + puVar1[0xb];
      auVar11[0xc] = puVar2[0xc] + puVar1[0xc];
      auVar11[0xd] = puVar2[0xd] + puVar1[0xd];
      auVar11[0xe] = puVar2[0xe] + puVar1[0xe];
      auVar11[0xf] = puVar2[0xf] + puVar1[0xf];
      auVar10 = pshufb(auVar11,_DAT_00a75320);
      auVar11 = pshufb(auVar11,_DAT_00b98080);
      auVar14 = auVar11 & auVar10;
      auVar11 = auVar11 ^ auVar10;
      auVar12._0_2_ = auVar11._0_2_ >> 1;
      auVar12._2_2_ = auVar11._2_2_ >> 1;
      auVar12._4_2_ = auVar11._4_2_ >> 1;
      auVar12._6_2_ = auVar11._6_2_ >> 1;
      auVar12._8_2_ = auVar11._8_2_ >> 1;
      auVar12._10_2_ = auVar11._10_2_ >> 1;
      auVar12._12_2_ = auVar11._12_2_ >> 1;
      auVar12._14_2_ = auVar11._14_2_ >> 1;
      auVar12 = auVar12 & _DAT_00a71130;
      auVar13[0] = auVar12[0] + auVar14[0];
      auVar13[1] = auVar12[1] + auVar14[1];
      auVar13[2] = auVar12[2] + auVar14[2];
      auVar13[3] = auVar12[3] + auVar14[3];
      auVar13[4] = auVar12[4] + auVar14[4];
      auVar13[5] = auVar12[5] + auVar14[5];
      auVar13[6] = auVar12[6] + auVar14[6];
      auVar13[7] = auVar12[7] + auVar14[7];
      auVar13[8] = auVar12[8] + auVar14[8];
      auVar13[9] = auVar12[9] + auVar14[9];
      auVar13[10] = auVar12[10] + auVar14[10];
      auVar13[0xb] = auVar12[0xb] + auVar14[0xb];
      auVar13[0xc] = auVar12[0xc] + auVar14[0xc];
      auVar13[0xd] = auVar12[0xd] + auVar14[0xd];
      auVar13[0xe] = auVar12[0xe] + auVar14[0xe];
      auVar13[0xf] = auVar12[0xf] + auVar14[0xf];
      auVar10 = pmovzxbw(auVar10,auVar13);
      pavgw(auVar10._0_2_,0);
      pavgw(auVar10._2_2_,0);
      pavgw(auVar10._4_2_,0);
      pavgw(auVar10._6_2_,0);
      pavgw(auVar10._8_2_,0);
      pavgw(auVar10._10_2_,0);
      pavgw(auVar10._12_2_,0);
      pavgw(auVar10._14_2_,0);
      pmovsxbw(auVar13,0x4040404040404040);
      alVar15[1] = lVar3;
      alVar15[0] = (longlong)src0;
      alVar16[1] = lVar4;
      alVar16[0] = (longlong)src1;
      alVar15 = (*blend)(puVar6,puVar8,alVar15,alVar16);
      src0 = alVar15[1];
      *(undefined8 *)(dst + lVar9) = extraout_XMM0_Qa;
      *(undefined8 *)(dst + lVar9 + 4) = extraout_XMM0_Qb;
      puVar8 = puVar8 + 8;
      puVar6 = puVar6 + 8;
    }
    mask = mask + mask_stride * 2;
    dst = dst + dst_stride;
    puVar7 = puVar7 + src1_stride;
    puVar5 = puVar5 + src0_stride;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static inline void blend_a64_mask_bn_sx_sy_w8n_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h,
    blend_unit_fn blend) {
  const __m128i v_zmask_b =
      _mm_set_epi8(0, -1, 0, -1, 0, -1, 0, -1, 0, -1, 0, -1, 0, -1, 0, -1);
  const __m128i v_maxval_w = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);

  do {
    int c;
    for (c = 0; c < w; c += 8) {
      const __m128i v_ra_b = xx_loadu_128(mask + 2 * c);
      const __m128i v_rb_b = xx_loadu_128(mask + 2 * c + mask_stride);
      const __m128i v_rvs_b = _mm_add_epi8(v_ra_b, v_rb_b);
      const __m128i v_rvsa_w = _mm_and_si128(v_rvs_b, v_zmask_b);
      const __m128i v_rvsb_w =
          _mm_and_si128(_mm_srli_si128(v_rvs_b, 1), v_zmask_b);
      const __m128i v_rs_w = _mm_add_epi16(v_rvsa_w, v_rvsb_w);

      const __m128i v_m0_w = xx_roundn_epu16(v_rs_w, 2);
      const __m128i v_m1_w = _mm_sub_epi16(v_maxval_w, v_m0_w);

      const __m128i v_res_w = blend(src0 + c, src1 + c, v_m0_w, v_m1_w);

      xx_storeu_128(dst + c, v_res_w);
    }
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += 2 * mask_stride;
  } while (--h);
}